

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voting.cpp
# Opt level: O3

unsigned_long query_int<unsigned_long,char_const(&)[19]>(char (*prompt) [19])

{
  unsigned_long res;
  string read_data;
  istringstream converter;
  unsigned_long local_1b0;
  string local_1a8;
  istringstream local_188 [120];
  ios_base local_110 [264];
  
  query_str<char_const(&)[19]>(&local_1a8,prompt);
  std::__cxx11::istringstream::istringstream(local_188,(string *)&local_1a8,_S_in);
  std::istream::_M_extract<unsigned_long>((ulong *)local_188);
  std::__cxx11::istringstream::~istringstream(local_188);
  std::ios_base::~ios_base(local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  return local_1b0;
}

Assistant:

Integer query_int(T && prompt)
{
    const std::string read_data = query_str(std::forward<T>(prompt));

    std::istringstream converter(read_data);

    Integer res;

    converter >> res;

    return res;
}